

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_28cd67::ArgParser::initOptionTables::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this)

{
  anon_class_1_0_00000001 *this_local;
  
  return;
}

Assistant:

void
ArgParser::argPositional(std::string const& arg)
{
    if (!this->gave_input) {
        c_main->inputFile(arg);
        this->gave_input = true;
    } else if (!this->gave_output) {
        c_main->outputFile(arg);
        this->gave_output = true;
    } else {
        usage("unknown argument " + arg);
    }
}